

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTD_symbolEncodingTypeStats_t *
ZSTD_buildSequencesStatistics
          (seqStore_t *seqStorePtr,size_t nbSeq,ZSTD_fseCTables_t *prevEntropy,
          ZSTD_fseCTables_t *nextEntropy,BYTE *dst,BYTE *dstEnd,ZSTD_strategy strategy,
          uint *countWorkspace,void *entropyWorkspace,size_t entropyWkspSize)

{
  U32 defaultMax;
  int iVar1;
  symbolEncodingType_e sVar2;
  uint uVar3;
  uint uVar4;
  S16 *defaultNorm;
  size_t sVar5;
  short *defaultNorm_00;
  FSE_CTable *pFVar6;
  FSE_CTable *nextCTable;
  FSE_repeat *repeatMode;
  size_t sVar7;
  long in_RCX;
  void *in_RDX;
  long in_RSI;
  ZSTD_symbolEncodingTypeStats_t *in_RDI;
  long in_R8;
  FSE_CTable *in_R9;
  FSE_CTable *in_stack_00000008;
  size_t countSize_2;
  size_t mostFrequent_2;
  uint max_2;
  size_t countSize_1;
  ZSTD_defaultPolicy_e defaultPolicy;
  size_t mostFrequent_1;
  uint max_1;
  size_t countSize;
  size_t mostFrequent;
  uint max;
  BYTE *mlCodeTable;
  BYTE *llCodeTable;
  BYTE *ofCodeTable;
  FSE_CTable *CTable_MatchLength;
  FSE_CTable *CTable_OffsetBits;
  FSE_CTable *CTable_LitLength;
  BYTE *op;
  BYTE *oend;
  BYTE *ostart;
  void *in_stack_fffffffffffffeb8;
  void *workSpace;
  long lVar8;
  void *pvVar9;
  size_t in_stack_fffffffffffffec0;
  BYTE *codeTable;
  void *in_stack_fffffffffffffec8;
  uint *in_stack_fffffffffffffed0;
  S16 *pSVar10;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 uVar11;
  undefined4 in_stack_fffffffffffffedc;
  seqStore_t *in_stack_fffffffffffffef0;
  ZSTD_symbolEncodingTypeStats_t *nbSeq_00;
  size_t in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 uVar12;
  FSE_repeat *in_stack_ffffffffffffff38;
  symbolEncodingType_e in_stack_ffffffffffffff40;
  U32 in_stack_ffffffffffffff44;
  FSE_CTable *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  uint uVar13;
  short *in_stack_ffffffffffffff58;
  U32 defaultNormLog;
  ZSTD_defaultPolicy_e in_stack_ffffffffffffff68;
  ZSTD_strategy strategy_00;
  BYTE *codeTable_00;
  U32 defaultNormLog_00;
  FSE_CTable *entropyWorkspace_00;
  FSE_CTable *entropyWorkspaceSize;
  
  uVar4 = (uint)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  defaultMax = (int)in_R8 + 0x8b0;
  defaultNorm = (S16 *)(in_R8 + 0x304);
  sVar7 = *(size_t *)(in_RSI + 0x30);
  codeTable = *(BYTE **)(in_RSI + 0x20);
  strategy_00 = (ZSTD_strategy)*(undefined8 *)(in_RSI + 0x28);
  in_RDI->lastCountSize = 0;
  nbSeq_00 = in_RDI;
  lVar8 = in_R8;
  entropyWorkspace_00 = in_R9;
  entropyWorkspaceSize = in_R9;
  iVar1 = ZSTD_seqToCodes(in_stack_fffffffffffffef0);
  defaultNormLog_00 = (U32)lVar8;
  nbSeq_00->longOffsets = iVar1;
  if (in_stack_00000008 < in_R9) {
    __assert_fail("op <= oend",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x5b60,
                  "ZSTD_symbolEncodingTypeStats_t ZSTD_buildSequencesStatistics(const seqStore_t *, size_t, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, BYTE *, const BYTE *const, ZSTD_strategy, unsigned int *, void *, size_t)"
                 );
  }
  if (in_RDX == (void *)0x0) {
    __assert_fail("nbSeq != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x5b61,
                  "ZSTD_symbolEncodingTypeStats_t ZSTD_buildSequencesStatistics(const seqStore_t *, size_t, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, BYTE *, const BYTE *const, ZSTD_strategy, unsigned int *, void *, size_t)"
                 );
  }
  sVar5 = HIST_countFast_wksp((uint *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                              in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                              in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,0x32946d);
  *(undefined4 *)(in_R8 + 0xddc) = *(undefined4 *)(in_RCX + 0xddc);
  uVar11 = (undefined4)((ulong)(in_RCX + 0x8b0) >> 0x20);
  defaultNormLog = (U32)sVar5;
  sVar2 = ZSTD_selectEncodingType
                    (in_stack_ffffffffffffff38,
                     (uint *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),uVar4,
                     in_stack_ffffffffffffff20,(size_t)nbSeq_00,(uint)((ulong)in_RDI >> 0x20),
                     (FSE_CTable *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff58,defaultNormLog,in_stack_ffffffffffffff68,strategy_00)
  ;
  nbSeq_00->LLtype = sVar2;
  if ((nbSeq_00->LLtype < 2) && (*(int *)(in_R8 + 0xddc) != 0)) {
    __assert_fail("!(stats.LLtype < set_compressed && nextEntropy->litlength_repeatMode != FSE_repeat_none)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x5b6d,
                  "ZSTD_symbolEncodingTypeStats_t ZSTD_buildSequencesStatistics(const seqStore_t *, size_t, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, BYTE *, const BYTE *const, ZSTD_strategy, unsigned int *, void *, size_t)"
                 );
  }
  workSpace = (void *)CONCAT44(uVar11,0x23);
  pSVar10 = LL_defaultNorm;
  uVar11 = 6;
  pvVar9 = in_RDX;
  codeTable_00 = codeTable;
  defaultNorm_00 =
       (short *)ZSTD_buildCTable(in_stack_ffffffffffffff58,
                                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                 in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                                 in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,strategy_00,
                                 codeTable,sVar7,defaultNorm,defaultNormLog_00,defaultMax,in_R9,
                                 (size_t)in_stack_00000008,entropyWorkspace_00,
                                 (size_t)entropyWorkspaceSize);
  uVar3 = ZSTD_isError(0x32960d);
  if (uVar3 == 0) {
    if (nbSeq_00->LLtype == 2) {
      nbSeq_00->lastCountSize = (size_t)defaultNorm_00;
    }
    pFVar6 = (FSE_CTable *)((long)defaultNorm_00 + (long)in_R9);
    if (in_stack_00000008 < pFVar6) {
      __assert_fail("op <= oend",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x5b7e,
                    "ZSTD_symbolEncodingTypeStats_t ZSTD_buildSequencesStatistics(const seqStore_t *, size_t, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, BYTE *, const BYTE *const, ZSTD_strategy, unsigned int *, void *, size_t)"
                   );
    }
    uVar13 = 0x1f;
    nextCTable = (FSE_CTable *)
                 HIST_countFast_wksp((uint *)CONCAT44(in_stack_fffffffffffffedc,uVar11),
                                     (uint *)pSVar10,pvVar9,(size_t)codeTable,workSpace,0x3296ce);
    uVar3 = (uint)(uVar13 < 0x1d);
    *(undefined4 *)(in_R8 + 0xdd4) = *(undefined4 *)(in_RCX + 0xdd4);
    lVar8 = in_RCX;
    sVar2 = ZSTD_selectEncodingType
                      (in_stack_ffffffffffffff38,
                       (uint *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),uVar4,
                       in_stack_ffffffffffffff20,(size_t)nbSeq_00,(uint)((ulong)in_RDI >> 0x20),
                       (FSE_CTable *)CONCAT44(uVar13,in_stack_ffffffffffffff50),defaultNorm_00,
                       defaultNormLog,in_stack_ffffffffffffff68,strategy_00);
    nbSeq_00->Offtype = sVar2;
    if ((nbSeq_00->Offtype < 2) && (*(int *)(in_R8 + 0xdd4) != 0)) {
      __assert_fail("!(stats.Offtype < set_compressed && nextEntropy->offcode_repeatMode != FSE_repeat_none)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x5b8d,
                    "ZSTD_symbolEncodingTypeStats_t ZSTD_buildSequencesStatistics(const seqStore_t *, size_t, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, BYTE *, const BYTE *const, ZSTD_strategy, unsigned int *, void *, size_t)"
                   );
    }
    pvVar9 = (void *)CONCAT44((int)((ulong)lVar8 >> 0x20),uVar13);
    pSVar10 = OF_defaultNorm;
    uVar11 = 5;
    sVar5 = sVar7;
    repeatMode = (FSE_repeat *)
                 ZSTD_buildCTable(defaultNorm_00,CONCAT44(uVar13,in_stack_ffffffffffffff50),
                                  nextCTable,uVar3,in_stack_ffffffffffffff40,
                                  in_stack_ffffffffffffff38,strategy_00,codeTable_00,sVar7,
                                  defaultNorm,defaultNormLog_00,defaultMax,pFVar6,
                                  (size_t)in_stack_00000008,entropyWorkspace_00,
                                  (size_t)entropyWorkspaceSize);
    uVar4 = ZSTD_isError(0x329883);
    if (uVar4 == 0) {
      if (nbSeq_00->Offtype == 2) {
        nbSeq_00->lastCountSize = (size_t)repeatMode;
      }
      pFVar6 = (FSE_CTable *)((long)repeatMode + (long)pFVar6);
      if (in_stack_00000008 < pFVar6) {
        __assert_fail("op <= oend",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x5b9e,
                      "ZSTD_symbolEncodingTypeStats_t ZSTD_buildSequencesStatistics(const seqStore_t *, size_t, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, BYTE *, const BYTE *const, ZSTD_strategy, unsigned int *, void *, size_t)"
                     );
      }
      uVar12 = 0x34;
      sVar7 = HIST_countFast_wksp((uint *)CONCAT44(in_stack_fffffffffffffedc,uVar11),(uint *)pSVar10
                                  ,in_RDX,sVar7,pvVar9,0x32993f);
      *(undefined4 *)(in_R8 + 0xdd8) = *(undefined4 *)(in_RCX + 0xdd8);
      sVar2 = ZSTD_selectEncodingType
                        (repeatMode,(uint *)CONCAT44(uVar12,in_stack_ffffffffffffff30),
                         (uint)(sVar7 >> 0x20),in_stack_ffffffffffffff20,(size_t)nbSeq_00,
                         (uint)((ulong)in_RDI >> 0x20),
                         (FSE_CTable *)CONCAT44(uVar13,in_stack_ffffffffffffff50),defaultNorm_00,
                         defaultNormLog,in_stack_ffffffffffffff68,strategy_00);
      nbSeq_00->MLtype = sVar2;
      if ((nbSeq_00->MLtype < 2) && (*(int *)(in_R8 + 0xdd8) != 0)) {
        __assert_fail("!(stats.MLtype < set_compressed && nextEntropy->matchlength_repeatMode != FSE_repeat_none)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x5bab,
                      "ZSTD_symbolEncodingTypeStats_t ZSTD_buildSequencesStatistics(const seqStore_t *, size_t, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, BYTE *, const BYTE *const, ZSTD_strategy, unsigned int *, void *, size_t)"
                     );
      }
      sVar7 = ZSTD_buildCTable(defaultNorm_00,CONCAT44(uVar13,in_stack_ffffffffffffff50),nextCTable,
                               uVar3,in_stack_ffffffffffffff40,repeatMode,strategy_00,codeTable_00,
                               sVar5,defaultNorm,defaultNormLog_00,defaultMax,pFVar6,
                               (size_t)in_stack_00000008,entropyWorkspace_00,
                               (size_t)entropyWorkspaceSize);
      uVar4 = ZSTD_isError(0x329ad0);
      if (uVar4 == 0) {
        if (nbSeq_00->MLtype == 2) {
          nbSeq_00->lastCountSize = sVar7;
        }
        if (in_stack_00000008 < (FSE_CTable *)(sVar7 + (long)pFVar6)) {
          __assert_fail("op <= oend",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x5bbc,
                        "ZSTD_symbolEncodingTypeStats_t ZSTD_buildSequencesStatistics(const seqStore_t *, size_t, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, BYTE *, const BYTE *const, ZSTD_strategy, unsigned int *, void *, size_t)"
                       );
        }
        nbSeq_00->size = (long)(sVar7 + (long)pFVar6) - (long)entropyWorkspace_00;
      }
      else {
        nbSeq_00->size = sVar7;
      }
    }
    else {
      nbSeq_00->size = (size_t)repeatMode;
    }
  }
  else {
    nbSeq_00->size = (size_t)defaultNorm_00;
  }
  return in_RDI;
}

Assistant:

static ZSTD_symbolEncodingTypeStats_t
ZSTD_buildSequencesStatistics(
                const seqStore_t* seqStorePtr, size_t nbSeq,
                const ZSTD_fseCTables_t* prevEntropy, ZSTD_fseCTables_t* nextEntropy,
                      BYTE* dst, const BYTE* const dstEnd,
                      ZSTD_strategy strategy, unsigned* countWorkspace,
                      void* entropyWorkspace, size_t entropyWkspSize)
{
    BYTE* const ostart = dst;
    const BYTE* const oend = dstEnd;
    BYTE* op = ostart;
    FSE_CTable* CTable_LitLength = nextEntropy->litlengthCTable;
    FSE_CTable* CTable_OffsetBits = nextEntropy->offcodeCTable;
    FSE_CTable* CTable_MatchLength = nextEntropy->matchlengthCTable;
    const BYTE* const ofCodeTable = seqStorePtr->ofCode;
    const BYTE* const llCodeTable = seqStorePtr->llCode;
    const BYTE* const mlCodeTable = seqStorePtr->mlCode;
    ZSTD_symbolEncodingTypeStats_t stats;

    stats.lastCountSize = 0;
    /* convert length/distances into codes */
    stats.longOffsets = ZSTD_seqToCodes(seqStorePtr);
    assert(op <= oend);
    assert(nbSeq != 0); /* ZSTD_selectEncodingType() divides by nbSeq */
    /* build CTable for Literal Lengths */
    {   unsigned max = MaxLL;
        size_t const mostFrequent = HIST_countFast_wksp(countWorkspace, &max, llCodeTable, nbSeq, entropyWorkspace, entropyWkspSize);   /* can't fail */
        DEBUGLOG(5, "Building LL table");
        nextEntropy->litlength_repeatMode = prevEntropy->litlength_repeatMode;
        stats.LLtype = ZSTD_selectEncodingType(&nextEntropy->litlength_repeatMode,
                                        countWorkspace, max, mostFrequent, nbSeq,
                                        LLFSELog, prevEntropy->litlengthCTable,
                                        LL_defaultNorm, LL_defaultNormLog,
                                        ZSTD_defaultAllowed, strategy);
        assert(set_basic < set_compressed && set_rle < set_compressed);
        assert(!(stats.LLtype < set_compressed && nextEntropy->litlength_repeatMode != FSE_repeat_none)); /* We don't copy tables */
        {   size_t const countSize = ZSTD_buildCTable(
                op, (size_t)(oend - op),
                CTable_LitLength, LLFSELog, (symbolEncodingType_e)stats.LLtype,
                countWorkspace, max, llCodeTable, nbSeq,
                LL_defaultNorm, LL_defaultNormLog, MaxLL,
                prevEntropy->litlengthCTable,
                sizeof(prevEntropy->litlengthCTable),
                entropyWorkspace, entropyWkspSize);
            if (ZSTD_isError(countSize)) {
                DEBUGLOG(3, "ZSTD_buildCTable for LitLens failed");
                stats.size = countSize;
                return stats;
            }
            if (stats.LLtype == set_compressed)
                stats.lastCountSize = countSize;
            op += countSize;
            assert(op <= oend);
    }   }
    /* build CTable for Offsets */
    {   unsigned max = MaxOff;
        size_t const mostFrequent = HIST_countFast_wksp(
            countWorkspace, &max, ofCodeTable, nbSeq, entropyWorkspace, entropyWkspSize);  /* can't fail */
        /* We can only use the basic table if max <= DefaultMaxOff, otherwise the offsets are too large */
        ZSTD_defaultPolicy_e const defaultPolicy = (max <= DefaultMaxOff) ? ZSTD_defaultAllowed : ZSTD_defaultDisallowed;
        DEBUGLOG(5, "Building OF table");
        nextEntropy->offcode_repeatMode = prevEntropy->offcode_repeatMode;
        stats.Offtype = ZSTD_selectEncodingType(&nextEntropy->offcode_repeatMode,
                                        countWorkspace, max, mostFrequent, nbSeq,
                                        OffFSELog, prevEntropy->offcodeCTable,
                                        OF_defaultNorm, OF_defaultNormLog,
                                        defaultPolicy, strategy);
        assert(!(stats.Offtype < set_compressed && nextEntropy->offcode_repeatMode != FSE_repeat_none)); /* We don't copy tables */
        {   size_t const countSize = ZSTD_buildCTable(
                op, (size_t)(oend - op),
                CTable_OffsetBits, OffFSELog, (symbolEncodingType_e)stats.Offtype,
                countWorkspace, max, ofCodeTable, nbSeq,
                OF_defaultNorm, OF_defaultNormLog, DefaultMaxOff,
                prevEntropy->offcodeCTable,
                sizeof(prevEntropy->offcodeCTable),
                entropyWorkspace, entropyWkspSize);
            if (ZSTD_isError(countSize)) {
                DEBUGLOG(3, "ZSTD_buildCTable for Offsets failed");
                stats.size = countSize;
                return stats;
            }
            if (stats.Offtype == set_compressed)
                stats.lastCountSize = countSize;
            op += countSize;
            assert(op <= oend);
    }   }
    /* build CTable for MatchLengths */
    {   unsigned max = MaxML;
        size_t const mostFrequent = HIST_countFast_wksp(
            countWorkspace, &max, mlCodeTable, nbSeq, entropyWorkspace, entropyWkspSize);   /* can't fail */
        DEBUGLOG(5, "Building ML table (remaining space : %i)", (int)(oend-op));
        nextEntropy->matchlength_repeatMode = prevEntropy->matchlength_repeatMode;
        stats.MLtype = ZSTD_selectEncodingType(&nextEntropy->matchlength_repeatMode,
                                        countWorkspace, max, mostFrequent, nbSeq,
                                        MLFSELog, prevEntropy->matchlengthCTable,
                                        ML_defaultNorm, ML_defaultNormLog,
                                        ZSTD_defaultAllowed, strategy);
        assert(!(stats.MLtype < set_compressed && nextEntropy->matchlength_repeatMode != FSE_repeat_none)); /* We don't copy tables */
        {   size_t const countSize = ZSTD_buildCTable(
                op, (size_t)(oend - op),
                CTable_MatchLength, MLFSELog, (symbolEncodingType_e)stats.MLtype,
                countWorkspace, max, mlCodeTable, nbSeq,
                ML_defaultNorm, ML_defaultNormLog, MaxML,
                prevEntropy->matchlengthCTable,
                sizeof(prevEntropy->matchlengthCTable),
                entropyWorkspace, entropyWkspSize);
            if (ZSTD_isError(countSize)) {
                DEBUGLOG(3, "ZSTD_buildCTable for MatchLengths failed");
                stats.size = countSize;
                return stats;
            }
            if (stats.MLtype == set_compressed)
                stats.lastCountSize = countSize;
            op += countSize;
            assert(op <= oend);
    }   }
    stats.size = (size_t)(op-ostart);
    return stats;
}